

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_NumberIsInteger(JSContext *ctx,JSValue val)

{
  int iVar1;
  uint32_t tag;
  uint uVar2;
  uint uVar3;
  JSValueUnion __x;
  double dVar4;
  JSValueUnion local_10;
  
  __x = val.u;
  uVar3 = 0;
  uVar2 = (uint)val.tag;
  if ((uVar2 == 7) || (uVar2 == 0)) {
    if (uVar2 < 3) {
      __x.float64 = (double)val.u._0_4_;
    }
    else if ((uVar2 != 7) &&
            (iVar1 = __JS_ToFloat64Free(ctx,&local_10.float64,val), __x = local_10, iVar1 != 0)) {
      return -1;
    }
    if ((ulong)ABS(__x.float64) < 0x7ff0000000000000) {
      dVar4 = floor(__x.float64);
      uVar3 = -(uint)(dVar4 == __x.float64) & 1;
    }
  }
  return uVar3;
}

Assistant:

static int JS_NumberIsInteger(JSContext *ctx, JSValueConst val)
{
    double d;
    if (!JS_IsNumber(val))
        return FALSE;
    if (unlikely(JS_ToFloat64(ctx, &d, val)))
        return -1;
    return isfinite(d) && floor(d) == d;
}